

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.cpp
# Opt level: O0

void * Jinx::MemAllocate(size_t bytes)

{
  void *pvVar1;
  size_t bytes_local;
  
  std::__atomic_base<unsigned_long>::operator++
            (&Mem::allocationCount.super___atomic_base<unsigned_long>,0);
  std::__atomic_base<unsigned_long>::operator+=
            (&Mem::allocatedMemory.super___atomic_base<unsigned_long>,bytes);
  pvVar1 = std::function<void_*(unsigned_long)>::operator()(&Mem::allocFn,bytes);
  return pvVar1;
}

Assistant:

inline_t void * MemAllocate(size_t bytes)
	{
		Mem::allocationCount++;
		Mem::allocatedMemory += bytes;
		return reinterpret_cast<uint8_t *>(Mem::allocFn(bytes));
	}